

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O0

void __thiscall sysapi::epoll::modify(epoll *this,int fd,uint32_t events,epoll_registration *reg)

{
  int iVar1;
  int *piVar2;
  undefined1 local_2c [4];
  int r;
  epoll_event ev;
  epoll_registration *reg_local;
  uint32_t events_local;
  int fd_local;
  epoll *this_local;
  
  ev.data = (epoll_data_t)reg;
  memset(local_2c,0,0xc);
  _r = ev.data;
  local_2c = (undefined1  [4])events;
  iVar1 = weak_file_descriptor::getfd((weak_file_descriptor *)this);
  iVar1 = epoll_ctl(iVar1,3,fd,(epoll_event *)local_2c);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    throw_error(*piVar2,"epoll_ctl(EPOLL_CTL_MOD)");
  }
  return;
}

Assistant:

void epoll::modify(int fd, uint32_t events, epoll_registration* reg)
{
    epoll_event ev = {0, 0};
    ev.data.ptr = reg;
    ev.events   = events;

    int r = ::epoll_ctl(fd_.getfd(), EPOLL_CTL_MOD, fd, &ev);
    if (r < 0)
        throw_error(errno, "epoll_ctl(EPOLL_CTL_MOD)");
}